

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void __thiscall
kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
          (ExternalMutexGuarded<capnp::compiler::BrandedDecl> *this)

{
  Mutex *pMVar1;
  BrandedDecl local_f8;
  Type local_50;
  undefined1 local_48 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_h:449:7)>
  _kjDefer449;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_20;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *local_10;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *this_local;
  
  local_10 = this;
  if (this->mutex != (Mutex *)0x0) {
    pMVar1 = this->mutex;
    Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_20);
    kj::_::Mutex::lock(pMVar1,0,&local_20);
    Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_20);
    local_50.this = this;
    defer<kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded()::_lambda()_1_>
              ((kj *)local_48,&local_50);
    ::capnp::compiler::BrandedDecl::BrandedDecl(&local_f8);
    ::capnp::compiler::BrandedDecl::operator=(&this->value,&local_f8);
    ::capnp::compiler::BrandedDecl::~BrandedDecl(&local_f8);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.h:449:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_h:449:7)>
                 *)local_48);
  }
  ::capnp::compiler::BrandedDecl::~BrandedDecl(&this->value);
  return;
}

Assistant:

~ExternalMutexGuarded() noexcept(false) {
    if (mutex != nullptr) {
      mutex->lock(_::Mutex::EXCLUSIVE, kj::none, location);
      KJ_DEFER(mutex->unlock(_::Mutex::EXCLUSIVE));
      value = T();
    }
  }